

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ConstPromiseNode<unsigned_long,_0UL>::get
          (ConstPromiseNode<unsigned_long,_0UL> *this,ExceptionOrValue *output)

{
  ExceptionOr<unsigned_long> local_1a8;
  
  local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a8.value.ptr.isSet = true;
  local_1a8.value.ptr.field_1.value = 0;
  ExceptionOr<unsigned_long>::operator=((ExceptionOr<unsigned_long> *)output,&local_1a8);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1a8);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    output.as<T>() = value;
  }